

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getFederateNameNoThrow_abi_cxx11_(CommonCore *this,GlobalFederateId federateID)

{
  bool bVar1;
  int iVar2;
  GlobalFederateId GVar3;
  BaseType val;
  FederateState *this_00;
  LocalFederateId in_ESI;
  CommonCore *in_RDI;
  FederateState *fed;
  atomic<helics::GlobalFederateId> *in_stack_ffffffffffffffa8;
  string *local_50;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  CommonCore *this_01;
  string *local_8;
  
  this_01 = in_RDI;
  if (getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::filterString_abi_cxx11_ == '\0')
  {
    iVar2 = __cxa_guard_acquire(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                                 filterString_abi_cxx11_);
    if (iVar2 != 0) {
      getIdentifier_abi_cxx11_(in_RDI);
      std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      __cxa_atexit(std::__cxx11::string::~string,
                   &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                    filterString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                           filterString_abi_cxx11_);
    }
  }
  if (getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::translatorString_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                                 translatorString_abi_cxx11_);
    if (iVar2 != 0) {
      getIdentifier_abi_cxx11_(in_RDI);
      std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      __cxa_atexit(std::__cxx11::string::~string,
                   &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                    translatorString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                           translatorString_abi_cxx11_);
    }
  }
  GVar3 = std::atomic::operator_cast_to_GlobalFederateId(in_stack_ffffffffffffffa8);
  bVar1 = GlobalFederateId::operator==((GlobalFederateId *)&stack0xfffffffffffffff4,GVar3);
  if (bVar1) {
    local_8 = &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::filterString_abi_cxx11_;
  }
  else {
    GVar3 = std::atomic::operator_cast_to_GlobalFederateId(in_stack_ffffffffffffffa8);
    bVar1 = GlobalFederateId::operator==((GlobalFederateId *)&stack0xfffffffffffffff4,GVar3);
    if (bVar1) {
      local_8 = &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                 translatorString_abi_cxx11_;
    }
    else {
      val = GlobalFederateId::localIndex((GlobalFederateId *)&stack0xfffffffffffffff4);
      LocalFederateId::LocalFederateId((LocalFederateId *)&stack0xffffffffffffffd4,val);
      this_00 = getFederateAt(this_01,in_ESI);
      if (this_00 == (FederateState *)0x0) {
        local_50 = (string *)unknownString_abi_cxx11_;
      }
      else {
        local_50 = FederateState::getIdentifier_abi_cxx11_(this_00);
      }
      local_8 = local_50;
    }
  }
  return local_8;
}

Assistant:

const std::string& CommonCore::getFederateNameNoThrow(GlobalFederateId federateID) const noexcept
{
    static const std::string filterString = getIdentifier() + "_filters";
    static const std::string translatorString = getIdentifier() + "_translators";
    if (federateID == filterFedID) {
        return filterString;
    }
    if (federateID == translatorFedID) {
        return translatorString;
    }
    auto* fed = getFederateAt(LocalFederateId(federateID.localIndex()));
    return (fed == nullptr) ? unknownString : fed->getIdentifier();
}